

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11Xcb.cpp
# Opt level: O1

void __thiscall tcu::x11::XcbWindow::setVisibility(XcbWindow *this,bool visible)

{
  if ((this->super_WindowBase).m_visible == visible) {
    return;
  }
  if (visible) {
    xcb_map_window();
  }
  else {
    xcb_unmap_window(this->m_display->m_connection,this->m_window);
  }
  (this->super_WindowBase).m_visible = visible;
  xcb_flush(this->m_display->m_connection);
  return;
}

Assistant:

void XcbWindow::setVisibility (bool visible)
{
	if (visible == m_visible)
		return;

	if (visible)
		 xcb_map_window(m_display.getConnection(), m_window);
	else
		xcb_unmap_window(m_display.getConnection(), m_window);

	m_visible = visible;
	xcb_flush (m_display.getConnection());

}